

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_actual_can_merge(mcpl_file_t ff1,mcpl_file_t ff2)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  uint32_t i;
  mcpl_fileinternal_t *f2;
  mcpl_fileinternal_t *f1;
  uint local_2c;
  int local_4;
  
  if (*(long *)(in_RDI + 0x80) == *(long *)(in_RSI + 0x80)) {
    iVar1 = strcmp(*(char **)(in_RDI + 0x10),*(char **)(in_RSI + 0x10));
    if (iVar1 == 0) {
      if (*(int *)(in_RDI + 0x1c) == *(int *)(in_RSI + 0x1c)) {
        if (*(int *)(in_RDI + 0x20) == *(int *)(in_RSI + 0x20)) {
          if (*(int *)(in_RDI + 0x24) == *(int *)(in_RSI + 0x24)) {
            if (*(int *)(in_RDI + 0x28) == *(int *)(in_RSI + 0x28)) {
              if ((*(double *)(in_RDI + 0x30) != *(double *)(in_RSI + 0x30)) ||
                 (NAN(*(double *)(in_RDI + 0x30)) || NAN(*(double *)(in_RSI + 0x30)))) {
                local_4 = 0;
              }
              else if (*(int *)(in_RDI + 0x38) == *(int *)(in_RSI + 0x38)) {
                if (*(int *)(in_RDI + 0x78) == *(int *)(in_RSI + 0x78)) {
                  if (*(int *)(in_RDI + 0x48) == *(int *)(in_RSI + 0x48)) {
                    if (*(int *)(in_RDI + 0x58) == *(int *)(in_RSI + 0x58)) {
                      for (local_2c = 0; local_2c < *(uint *)(in_RDI + 0x48);
                          local_2c = local_2c + 1) {
                        iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 0x50) + (ulong)local_2c * 8),
                                       *(char **)(*(long *)(in_RSI + 0x50) + (ulong)local_2c * 8));
                        if (iVar1 != 0) {
                          return 0;
                        }
                      }
                      for (local_2c = 0; local_2c < *(uint *)(in_RDI + 0x58);
                          local_2c = local_2c + 1) {
                        if (*(int *)(*(long *)(in_RDI + 0x68) + (ulong)local_2c * 4) !=
                            *(int *)(*(long *)(in_RSI + 0x68) + (ulong)local_2c * 4)) {
                          return 0;
                        }
                        iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 0x60) + (ulong)local_2c * 8),
                                       *(char **)(*(long *)(in_RSI + 0x60) + (ulong)local_2c * 8));
                        if (iVar1 != 0) {
                          return 0;
                        }
                        iVar1 = memcmp(*(void **)(*(long *)(in_RDI + 0x70) + (ulong)local_2c * 8),
                                       *(void **)(*(long *)(in_RSI + 0x70) + (ulong)local_2c * 8),
                                       (ulong)*(uint *)(*(long *)(in_RDI + 0x68) +
                                                       (ulong)local_2c * 4));
                        if (iVar1 != 0) {
                          return 0;
                        }
                      }
                      local_4 = 1;
                    }
                    else {
                      local_4 = 0;
                    }
                  }
                  else {
                    local_4 = 0;
                  }
                }
                else {
                  local_4 = 0;
                }
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

MCPL_LOCAL int mcpl_actual_can_merge(mcpl_file_t ff1, mcpl_file_t ff2)
{
  mcpl_fileinternal_t * f1 = (mcpl_fileinternal_t *)ff1.internal;
  mcpl_fileinternal_t * f2 = (mcpl_fileinternal_t *)ff2.internal;
  assert(f1);
  assert(f2);
  if (f1->first_particle_pos!=f2->first_particle_pos)
    return 0;//different header

  //Note, we do not check the format_version field here, since mcpl_merge_files
  //can actually work on files with different versions.

  //Very strict checking of everything except nparticles. Even order of blobs
  //and comments must be preserved (could possibly be relaxed a bit):
  if (strcmp(f1->hdr_srcprogname,f2->hdr_srcprogname)!=0) return 0;
  if (f1->opt_userflags!=f2->opt_userflags) return 0;
  if (f1->opt_polarisation!=f2->opt_polarisation) return 0;
  if (f1->opt_singleprec!=f2->opt_singleprec) return 0;
  if (f1->opt_universalpdgcode!=f2->opt_universalpdgcode) return 0;
  if (f1->opt_universalweight!=f2->opt_universalweight) return 0;
  if (f1->is_little_endian!=f2->is_little_endian) return 0;
  if (f1->particle_size!=f2->particle_size) return 0;
  if (f1->ncomments!=f2->ncomments) return 0;
  if (f1->nblobs!=f2->nblobs) return 0;
  uint32_t i;
  for (i = 0; i<f1->ncomments; ++i) {
    if (strcmp(f1->comments[i],f2->comments[i])!=0) return 0;
  }
  for (i = 0; i<f1->nblobs; ++i) {
    if (f1->bloblengths[i]!=f2->bloblengths[i]) return 0;
    if (strcmp(f1->blobkeys[i],f2->blobkeys[i])!=0) return 0;
    if (memcmp(f1->blobs[i],f2->blobs[i],f1->bloblengths[i])!=0) return 0;
  }
  return 1;
}